

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  float fVar1;
  ImVec2 IVar2;
  ushort uVar3;
  uint *puVar4;
  uchar *puVar5;
  uint *puVar6;
  ImFont *pIVar7;
  ImFont **ppIVar8;
  ImFontAtlasCustomRect *pIVar9;
  int iVar10;
  long lVar11;
  int i;
  long lVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  float fVar22;
  ImVec2 local_40;
  ImVec2 local_38;
  ulong uVar21;
  
  iVar13 = atlas->PackIdMouseCursors;
  pIVar9 = (atlas->CustomRects).Data;
  uVar3 = pIVar9[iVar13].X;
  if ((atlas->Flags & 2) == 0) {
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      ImFontAtlasBuildRender32bppRectFromString
                (atlas,(uint)uVar3,(uint)pIVar9[iVar13].Y,0x7a,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
                 ,'.',0xffffffff);
      ImFontAtlasBuildRender32bppRectFromString
                (atlas,uVar3 + 0x7b,(uint)pIVar9[iVar13].Y,0x7a,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
                 ,'X',0xffffffff);
    }
    else {
      ImFontAtlasBuildRender8bppRectFromString
                (atlas,(uint)uVar3,(uint)pIVar9[iVar13].Y,0x7a,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
                 ,'.',0xff);
      ImFontAtlasBuildRender8bppRectFromString
                (atlas,uVar3 + 0x7b,(uint)pIVar9[iVar13].Y,0x7a,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
                 ,'X',0xff);
    }
  }
  else {
    iVar14 = atlas->TexWidth;
    lVar12 = (ulong)pIVar9[iVar13].Y * (long)iVar14 + (ulong)uVar3;
    iVar10 = (int)lVar12;
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      puVar4 = atlas->TexPixelsRGBA32;
      puVar6 = puVar4 + (iVar14 + iVar10);
      puVar6[0] = 0xffffffff;
      puVar6[1] = 0xffffffff;
      puVar4 = puVar4 + iVar10;
      puVar4[0] = 0xffffffff;
      puVar4[1] = 0xffffffff;
    }
    else {
      lVar11 = (long)iVar10 + (long)iVar14;
      atlas->TexPixelsAlpha8[lVar11 + 1] = 0xff;
      atlas->TexPixelsAlpha8[lVar11] = 0xff;
      atlas->TexPixelsAlpha8[lVar12 + 1] = 0xff;
      atlas->TexPixelsAlpha8[lVar12] = 0xff;
    }
  }
  uVar15._0_2_ = pIVar9[iVar13].X;
  uVar15._2_2_ = pIVar9[iVar13].Y;
  IVar2 = atlas->TexUvScale;
  (atlas->TexUvWhitePixel).x = IVar2.x * ((float)(uVar15 & 0xffff) + 0.5);
  (atlas->TexUvWhitePixel).y = IVar2.y * ((float)(uVar15 >> 0x10) + 0.5);
  if ((atlas->Flags & 4) == 0) {
    pIVar9 = (atlas->CustomRects).Data + atlas->PackIdLines;
    lVar11 = 0;
    iVar13 = 0;
    lVar12 = 0;
    while (lVar12 != 0x40) {
      uVar15 = (uint)pIVar9->Width;
      puVar5 = atlas->TexPixelsAlpha8;
      iVar14 = (int)lVar12;
      if (puVar5 == (uchar *)0x0) {
        puVar6 = atlas->TexPixelsRGBA32;
        uVar16 = (uint)pIVar9->X;
        uVar3 = pIVar9->Y;
        uVar21 = (ulong)((iVar14 + (uint)uVar3) * atlas->TexWidth + uVar16);
        uVar20 = iVar13 + uVar15 >> 1;
        uVar17 = (ulong)uVar20;
        for (uVar18 = 0; uVar17 != uVar18; uVar18 = uVar18 + 1) {
          puVar6[uVar21 + uVar18] = 0xffffff;
        }
        for (lVar19 = 0; lVar12 != lVar19; lVar19 = lVar19 + 1) {
          puVar6[uVar17 + uVar21 + lVar19] = 0xffffffff;
        }
        for (uVar18 = 0; (iVar13 + uVar15) - uVar20 != uVar18; uVar18 = uVar18 + 1) {
          *(undefined4 *)((long)puVar6 + uVar18 * 4 + lVar11 + uVar17 * 4 + uVar21 * 4) = 0xffffff;
        }
      }
      else {
        uVar17 = (ulong)(((uint)pIVar9->Y + iVar14) * atlas->TexWidth + (uint)pIVar9->X);
        uVar20 = iVar13 + uVar15 >> 1;
        uVar21 = (ulong)uVar20;
        for (uVar18 = 0; uVar21 != uVar18; uVar18 = uVar18 + 1) {
          puVar5[uVar18 + uVar17] = '\0';
        }
        for (lVar19 = 0; lVar12 != lVar19; lVar19 = lVar19 + 1) {
          puVar5[lVar19 + uVar17 + uVar21] = 0xff;
        }
        for (uVar18 = 0; (iVar13 + uVar15) - uVar20 != uVar18; uVar18 = uVar18 + 1) {
          puVar5[uVar18 + uVar17 + uVar21 + lVar12] = '\0';
        }
        uVar16 = (uint)pIVar9->X;
        uVar3 = pIVar9->Y;
      }
      uVar15 = uVar15 - iVar14 >> 1;
      fVar1 = (atlas->TexUvScale).x;
      fVar22 = (atlas->TexUvScale).y;
      atlas->TexUvLines[lVar12].x = (float)((uVar16 + uVar15) - 1) * fVar1;
      fVar22 = ((float)(int)((uint)uVar3 + iVar14 + 1) * fVar22 +
               (float)(int)((uint)uVar3 + iVar14) * fVar22) * 0.5;
      atlas->TexUvLines[lVar12].y = fVar22;
      atlas->TexUvLines[lVar12].z = fVar1 * (float)(uVar16 + uVar15 + (int)(lVar12 + 1));
      atlas->TexUvLines[lVar12].w = fVar22;
      iVar13 = iVar13 + -1;
      lVar11 = lVar11 + 4;
      lVar12 = lVar12 + 1;
    }
  }
  lVar11 = 0;
  for (lVar12 = 0; lVar12 < (atlas->CustomRects).Size; lVar12 = lVar12 + 1) {
    pIVar9 = (atlas->CustomRects).Data;
    pIVar7 = *(ImFont **)((long)&pIVar9->Font + lVar11);
    if ((pIVar7 != (ImFont *)0x0) &&
       (iVar13 = *(int *)((long)&pIVar9->GlyphID + lVar11), iVar13 != 0)) {
      local_38.x = 0.0;
      local_38.y = 0.0;
      local_40.x = 0.0;
      local_40.y = 0.0;
      ImFontAtlas::CalcCustomRectUV
                (atlas,(ImFontAtlasCustomRect *)((long)&pIVar9->Width + lVar11),&local_38,&local_40)
      ;
      fVar1 = *(float *)((long)&(pIVar9->GlyphOffset).x + lVar11);
      fVar22 = *(float *)((long)&(pIVar9->GlyphOffset).y + lVar11);
      ImFont::AddGlyph(pIVar7,(ImFontConfig *)0x0,(ImWchar)iVar13,fVar1,fVar22,
                       (float)*(ushort *)((long)&pIVar9->Width + lVar11) + fVar1,
                       (float)*(ushort *)((long)&pIVar9->Height + lVar11) + fVar22,local_38.x,
                       local_38.y,local_40.x,local_40.y,
                       *(float *)((long)&pIVar9->GlyphAdvanceX + lVar11));
    }
    lVar11 = lVar11 + 0x20;
  }
  ppIVar8 = (atlas->Fonts).Data;
  iVar13 = (atlas->Fonts).Size;
  for (lVar12 = 0; (long)iVar13 * 8 != lVar12; lVar12 = lVar12 + 8) {
    pIVar7 = *(ImFont **)((long)ppIVar8 + lVar12);
    if (pIVar7->DirtyLookupTables == true) {
      ImFont::BuildLookupTable(pIVar7);
    }
  }
  atlas->TexReady = true;
  return;
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data blocks
    IM_ASSERT(atlas->TexPixelsAlpha8 != NULL || atlas->TexPixelsRGBA32 != NULL);
    ImFontAtlasBuildRenderDefaultTexData(atlas);
    ImFontAtlasBuildRenderLinesTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlasCustomRect* r = &atlas->CustomRects[i];
        if (r->Font == NULL || r->GlyphID == 0)
            continue;

        // Will ignore ImFontConfig settings: GlyphMinAdvanceX, GlyphMinAdvanceY, GlyphExtraSpacing, PixelSnapH
        IM_ASSERT(r->Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(r, &uv0, &uv1);
        r->Font->AddGlyph(NULL, (ImWchar)r->GlyphID, r->GlyphOffset.x, r->GlyphOffset.y, r->GlyphOffset.x + r->Width, r->GlyphOffset.y + r->Height, uv0.x, uv0.y, uv1.x, uv1.y, r->GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (ImFont* font : atlas->Fonts)
        if (font->DirtyLookupTables)
            font->BuildLookupTable();

    atlas->TexReady = true;
}